

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool prvTidyParseConfigValue(TidyDocImpl *doc,TidyOptionId optId,ctmbstr optval)

{
  uint uVar1;
  tchar tVar2;
  Bool BVar3;
  StreamIn *pSVar4;
  bool bVar5;
  undefined1 local_58 [8];
  TidyBuffer inbuf;
  char buffer [11];
  Bool status;
  TidyOptionImpl *option;
  ctmbstr optval_local;
  TidyOptionId optId_local;
  TidyDocImpl *doc_local;
  
  stack0xffffffffffffffd8 = (TidyOptionImpl *)0x0;
  bVar5 = false;
  if (optId < N_TIDY_OPTIONS) {
    register0x00000008 = option_defs + optId;
    bVar5 = false;
    if (option_defs[optId].parser != (ParseProperty *)0x0) {
      bVar5 = optval != (ctmbstr)0x0;
    }
  }
  if (bVar5) {
    tidyBufInitWithAllocator((TidyBuffer *)local_58,doc->allocator);
    uVar1 = prvTidytmbstrlen(optval);
    tidyBufAttach((TidyBuffer *)local_58,(byte *)optval,uVar1 + 1);
    if (optId == TidyOutFile) {
      pSVar4 = prvTidyBufferInput(doc,(TidyBuffer *)local_58,0);
      (doc->config).cfgIn = pSVar4;
    }
    else {
      pSVar4 = prvTidyBufferInput(doc,(TidyBuffer *)local_58,0);
      (doc->config).cfgIn = pSVar4;
    }
    tVar2 = GetC(&doc->config);
    (doc->config).c = tVar2;
    buffer._3_4_ = (*stack0xffffffffffffffd8->parser)(doc,stack0xffffffffffffffd8);
    prvTidyfreeStreamIn((doc->config).cfgIn);
    (doc->config).cfgIn = (StreamIn *)0x0;
    tidyBufDetach((TidyBuffer *)local_58);
  }
  else {
    if (stack0xffffffffffffffd8 == (TidyOptionImpl *)0x0) {
      prvTidytmbsnprintf((tmbstr)((long)&inbuf.next + 1),0xb,"%u",(ulong)optId);
      prvTidyReportUnknownOption(doc,(ctmbstr)((long)&inbuf.next + 1));
    }
    else {
      prvTidyReportBadArgument(doc,stack0xffffffffffffffd8->name);
    }
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
  }
  BVar3._0_1_ = buffer[3];
  BVar3._1_1_ = buffer[4];
  BVar3._2_1_ = buffer[5];
  BVar3._3_1_ = buffer[6];
  return BVar3;
}

Assistant:

Bool TY_(ParseConfigValue)( TidyDocImpl* doc, TidyOptionId optId, ctmbstr optval )
{
    const TidyOptionImpl* option = NULL;
    /* #472: fail status if there is a NULL parser. @ralfjunker */
    Bool status = ( optId < N_TIDY_OPTIONS
                   && (option = option_defs + optId)->parser
                   && optval != NULL );

    if ( !status )
        if ( option )
            TY_(ReportBadArgument)(doc, option->name);
        else
        {
            /* If optId < N_TIDY_OPTIONS then option remains unassigned,
               and we have to fall back to an ugly error message. */
            enum { sizeBuf = 11 }; /* uint_max is 10 characters */
            char buffer[sizeBuf];
            TY_(tmbsnprintf(buffer, sizeBuf, "%u", optId));
            TY_(ReportUnknownOption(doc, buffer));
        }
    else
    {
        TidyBuffer inbuf;            /* Set up input source */
        tidyBufInitWithAllocator( &inbuf, doc->allocator );
        tidyBufAttach( &inbuf, (byte*)optval, TY_(tmbstrlen)(optval)+1 );
        if (optId == TidyOutFile)
            doc->config.cfgIn = TY_(BufferInput)( doc, &inbuf, RAW );
        else
            doc->config.cfgIn = TY_(BufferInput)( doc, &inbuf, RAW ); /* Issue #468 - Was ASCII! */
        doc->config.c = GetC( &doc->config );

        status = option->parser( doc, option );

        TY_(freeStreamIn)(doc->config.cfgIn);  /* Release input source */
        doc->config.cfgIn  = NULL;
        tidyBufDetach( &inbuf );
    }
    return status;
}